

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

class_t * __thiscall cfgfile::generator::cfg::tag_class_t::cfg(tag_class_t *this)

{
  bool bVar1;
  pos_t pVar2;
  size_type sVar3;
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  *in_RSI;
  class_t *in_RDI;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  class_t *c;
  field_t *in_stack_fffffffffffffaf8;
  tag_field_t *in_stack_fffffffffffffb00;
  tag_base_class_t *in_stack_fffffffffffffb08;
  ulong uVar4;
  undefined7 in_stack_fffffffffffffb18;
  undefined1 in_stack_fffffffffffffb1f;
  class_t *in_stack_fffffffffffffb20;
  tag_base_class_t *in_stack_fffffffffffffbe8;
  tag_field_t *in_stack_fffffffffffffc18;
  ulong local_388;
  ulong local_2e8;
  ulong local_248;
  ulong local_1a8;
  ulong local_108;
  string local_68 [32];
  string local_48 [55];
  undefined1 local_11;
  
  local_11 = 0;
  class_t::class_t(in_stack_fffffffffffffb20);
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ::value(in_RSI);
  class_t::set_name((class_t *)in_stack_fffffffffffffb00,(string *)in_stack_fffffffffffffaf8);
  bVar1 = tag_t<cfgfile::string_trait_t>::is_defined
                    ((tag_t<cfgfile::string_trait_t> *)
                     CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
  if (bVar1) {
    tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
    ::value(in_RSI + 1);
    class_t::set_base_name((class_t *)in_stack_fffffffffffffb00,(string *)in_stack_fffffffffffffaf8)
    ;
    tag_base_class_t::tag_name_abi_cxx11_(in_stack_fffffffffffffb08);
    class_t::set_tag_name((class_t *)in_stack_fffffffffffffb00,(string *)in_stack_fffffffffffffaf8);
    std::__cxx11::string::~string(local_48);
    class_t::base_name_abi_cxx11_(in_RDI);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffb00,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffaf8);
    if (bVar1) {
      tag_base_class_t::value_type_abi_cxx11_(in_stack_fffffffffffffb08);
      class_t::set_base_value_type
                ((class_t *)in_stack_fffffffffffffb00,(string *)in_stack_fffffffffffffaf8);
      std::__cxx11::string::~string(local_68);
      tag_base_class_t::cfg(in_stack_fffffffffffffbe8);
      class_t::add_field((class_t *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      field_t::~field_t((field_t *)in_stack_fffffffffffffb00);
    }
  }
  pVar2 = tag_t<cfgfile::string_trait_t>::line_number(&in_RSI->super_tag_t<cfgfile::string_trait_t>)
  ;
  class_t::set_line_number(in_RDI,pVar2);
  pVar2 = tag_t<cfgfile::string_trait_t>::column_number
                    (&in_RSI->super_tag_t<cfgfile::string_trait_t>);
  class_t::set_column_number(in_RDI,pVar2);
  bVar1 = tag_t<cfgfile::string_trait_t>::is_defined
                    ((tag_t<cfgfile::string_trait_t> *)
                     CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
  if (bVar1) {
    for (local_108 = 0;
        sVar3 = tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>
                ::size((tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>
                        *)0x10e939), local_108 < sVar3; local_108 = local_108 + 1) {
      tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>::at
                ((tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>
                  *)in_stack_fffffffffffffb00,(size_type)in_stack_fffffffffffffaf8);
      tag_field_t::cfg(in_stack_fffffffffffffc18);
      class_t::add_field((class_t *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      field_t::~field_t((field_t *)in_stack_fffffffffffffb00);
    }
  }
  bVar1 = tag_t<cfgfile::string_trait_t>::is_defined
                    ((tag_t<cfgfile::string_trait_t> *)
                     CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
  if (bVar1) {
    for (local_1a8 = 0;
        sVar3 = tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>
                ::size((tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>
                        *)0x10ea58), local_1a8 < sVar3; local_1a8 = local_1a8 + 1) {
      tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>::at
                ((tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>
                  *)in_stack_fffffffffffffb00,(size_type)in_stack_fffffffffffffaf8);
      tag_field_t::cfg(in_stack_fffffffffffffc18);
      class_t::add_field((class_t *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      field_t::~field_t((field_t *)in_stack_fffffffffffffb00);
    }
  }
  bVar1 = tag_t<cfgfile::string_trait_t>::is_defined
                    ((tag_t<cfgfile::string_trait_t> *)
                     CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
  if (bVar1) {
    for (local_248 = 0;
        sVar3 = tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>
                ::size((tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>
                        *)0x10eb62), local_248 < sVar3; local_248 = local_248 + 1) {
      tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>::at
                ((tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>
                  *)in_stack_fffffffffffffb00,(size_type)in_stack_fffffffffffffaf8);
      tag_field_t::cfg(in_stack_fffffffffffffc18);
      class_t::add_field((class_t *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      field_t::~field_t((field_t *)in_stack_fffffffffffffb00);
    }
  }
  bVar1 = tag_t<cfgfile::string_trait_t>::is_defined
                    ((tag_t<cfgfile::string_trait_t> *)
                     CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
  if (bVar1) {
    for (local_2e8 = 0;
        sVar3 = tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>
                ::size((tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>
                        *)0x10ec6c), local_2e8 < sVar3; local_2e8 = local_2e8 + 1) {
      tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>::at
                ((tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>
                  *)in_stack_fffffffffffffb00,(size_type)in_stack_fffffffffffffaf8);
      tag_field_t::cfg(in_stack_fffffffffffffc18);
      class_t::add_field((class_t *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      field_t::~field_t((field_t *)in_stack_fffffffffffffb00);
    }
  }
  bVar1 = tag_t<cfgfile::string_trait_t>::is_defined
                    ((tag_t<cfgfile::string_trait_t> *)
                     CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
  if (bVar1) {
    local_388 = 0;
    while (uVar4 = local_388,
          sVar3 = tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>
                  ::size((tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>
                          *)0x10ed76), uVar4 < sVar3) {
      in_stack_fffffffffffffb00 =
           tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>::at
                     ((tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>
                       *)in_stack_fffffffffffffb00,(size_type)in_stack_fffffffffffffaf8);
      tag_field_t::cfg(in_stack_fffffffffffffc18);
      class_t::add_field((class_t *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      field_t::~field_t((field_t *)in_stack_fffffffffffffb00);
      local_388 = local_388 + 1;
    }
  }
  return in_RDI;
}

Assistant:

class_t
tag_class_t::cfg() const
{
	class_t c;
	c.set_name( value() );

	if( m_base_class_name.is_defined() )
	{
		c.set_base_name( m_base_class_name.value() );

		c.set_tag_name( m_base_class_name.tag_name() );

		if( c.base_name() != c_no_value_tag_name )
		{
			c.set_base_value_type( m_base_class_name.value_type() );

			c.add_field( m_base_class_name.cfg() );
		}
	}

	c.set_line_number( line_number() );
	c.set_column_number( column_number() );

	if( m_scalar_tags.is_defined() )
	{
		for( std::size_t i = 0; i < m_scalar_tags.size(); ++i )
			c.add_field( m_scalar_tags.at( i ).cfg() );
	}

	if( m_no_value_tags.is_defined() )
	{
		for( std::size_t i = 0; i < m_no_value_tags.size(); ++i )
			c.add_field( m_no_value_tags.at( i ).cfg() );
	}

	if( m_scalar_vector_tags.is_defined() )
	{
		for( std::size_t i = 0; i < m_scalar_vector_tags.size(); ++i )
			c.add_field( m_scalar_vector_tags.at( i ).cfg() );
	}

	if( m_vector_of_tags_tags.is_defined() )
	{
		for( std::size_t i = 0; i < m_vector_of_tags_tags.size(); ++i )
			c.add_field( m_vector_of_tags_tags.at( i ).cfg() );
	}

	if( m_custom_tags.is_defined() )
	{
		for( std::size_t i = 0; i < m_custom_tags.size(); ++i )
			c.add_field( m_custom_tags.at( i ).cfg() );
	}

	return c;
}